

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>::
operator()(ShadedRenderer<ImPlot::GetterYs<long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  int iVar3;
  GetterYs<long_long> *pGVar4;
  GetterYRef *pGVar5;
  ImDrawVert *pIVar6;
  ImDrawIdx *pIVar7;
  ImVec2 IVar8;
  float fVar9;
  undefined1 auVar10 [12];
  int iVar11;
  ImPlotContext *gp;
  ImDrawIdx IVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  ImVec2 IVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  double dVar26;
  float fVar27;
  double dVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar36 [16];
  
  dVar21 = (double)(prim + 1);
  pGVar4 = this->Getter1;
  pGVar5 = this->Getter2;
  iVar11 = pGVar4->Count;
  iVar3 = this->Transformer->YAxis;
  IVar22 = GImPlot->PixelRange[iVar3].Min;
  dVar26 = (double)IVar22.x;
  dVar28 = (double)IVar22.y;
  dVar1 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar3].Range.Min;
  fVar19 = (float)(((pGVar4->XScale * dVar21 + pGVar4->X0) - dVar1) * GImPlot->Mx + dVar26);
  fVar20 = (float)(((double)*(long *)((long)pGVar4->Ys +
                                     (long)(((prim + 1 + pGVar4->Offset) % iVar11 + iVar11) % iVar11
                                           ) * (long)pGVar4->Stride) - dVar2) * GImPlot->My[iVar3] +
                  dVar28);
  IVar22.x = (float)(((dVar21 * pGVar5->XScale + pGVar5->X0) - dVar1) * GImPlot->Mx + dVar26);
  IVar22.y = (float)((pGVar5->YRef - dVar2) * GImPlot->My[iVar3] + dVar28);
  fVar9 = (this->P12).x;
  fVar23 = (this->P12).y;
  fVar25 = (this->P11).x;
  fVar27 = (this->P11).y;
  uVar17 = -(uint)(fVar27 < fVar23);
  fVar24 = (float)(~-(uint)(fVar9 <= fVar25) & (uint)fVar9 | (uint)fVar25 & -(uint)(fVar9 <= fVar25)
                  );
  fVar29 = (float)(~-(uint)(fVar23 <= fVar27) & (uint)fVar23 |
                  (uint)fVar27 & -(uint)(fVar23 <= fVar27));
  fVar32 = (float)(~-(uint)(fVar25 < fVar9) & (uint)fVar9 | (uint)fVar25 & -(uint)(fVar25 < fVar9));
  fVar40 = (float)(~uVar17 & (uint)fVar23 | (uint)fVar27 & uVar17);
  uVar14 = -(uint)(fVar19 <= fVar24);
  uVar15 = -(uint)(fVar20 <= fVar29);
  uVar16 = -(uint)(fVar32 < fVar19);
  uVar18 = -(uint)(fVar40 < fVar20);
  fVar24 = (float)(~uVar14 & (uint)fVar19 | (uint)fVar24 & uVar14);
  fVar29 = (float)(~uVar15 & (uint)fVar20 | (uint)fVar29 & uVar15);
  fVar32 = (float)(~uVar16 & (uint)fVar19 | (uint)fVar32 & uVar16);
  fVar40 = (float)(~uVar18 & (uint)fVar20 | (uint)fVar40 & uVar18);
  uVar14 = -(uint)(IVar22.x <= fVar24);
  uVar15 = -(uint)(IVar22.y <= fVar29);
  uVar16 = -(uint)(fVar32 < IVar22.x);
  uVar18 = -(uint)(fVar40 < IVar22.y);
  auVar31._0_4_ = (uint)fVar24 & uVar14;
  auVar31._4_4_ = (uint)fVar29 & uVar15;
  auVar31._8_4_ = (uint)fVar32 & uVar16;
  auVar31._12_4_ = (uint)fVar40 & uVar18;
  auVar37._0_4_ = ~uVar14 & (uint)IVar22.x;
  auVar37._4_4_ = ~uVar15 & (uint)IVar22.y;
  auVar37._8_4_ = ~uVar16 & (uint)IVar22.x;
  auVar37._12_4_ = ~uVar18 & (uint)IVar22.y;
  auVar37 = auVar37 | auVar31;
  fVar24 = (cull_rect->Min).y;
  auVar39._4_4_ = -(uint)(fVar24 < auVar37._4_4_);
  auVar39._0_4_ = -(uint)((cull_rect->Min).x < auVar37._0_4_);
  auVar10._4_8_ = auVar37._8_8_;
  auVar10._0_4_ = -(uint)(auVar37._4_4_ < fVar24);
  auVar38._0_8_ = auVar10._0_8_ << 0x20;
  auVar38._8_4_ = -(uint)(auVar37._8_4_ < (cull_rect->Max).x);
  auVar38._12_4_ = -(uint)(auVar37._12_4_ < (cull_rect->Max).y);
  auVar39._8_8_ = auVar38._8_8_;
  iVar11 = movmskps((int)GImPlot,auVar39);
  if (iVar11 == 0xf) {
    fVar29 = fVar20 * fVar25 - fVar27 * fVar19;
    fVar32 = IVar22.y * fVar9 - fVar23 * IVar22.x;
    fVar24 = fVar23 - IVar22.y;
    auVar33._4_4_ = fVar24;
    auVar33._0_4_ = fVar24;
    auVar33._8_4_ = fVar24;
    auVar33._12_4_ = fVar24;
    auVar34._4_12_ = auVar33._4_12_;
    auVar34._0_4_ = fVar24 * (fVar25 - fVar19) - (fVar27 - fVar20) * (fVar9 - IVar22.x);
    auVar30._0_4_ = fVar29 * (fVar9 - IVar22.x) - fVar32 * (fVar25 - fVar19);
    auVar30._4_4_ = fVar29 * fVar24 - fVar32 * (fVar27 - fVar20);
    auVar30._8_4_ = fVar20 * 0.0 - IVar22.y * 0.0;
    auVar30._12_4_ = fVar20 * 0.0 - IVar22.y * 0.0;
    auVar36._0_8_ = auVar34._0_8_;
    auVar36._8_4_ = fVar24;
    auVar36._12_4_ = fVar24;
    auVar35._8_8_ = auVar36._8_8_;
    auVar35._4_4_ = auVar34._0_4_;
    auVar35._0_4_ = auVar34._0_4_;
    auVar31 = divps(auVar30,auVar35);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6->col = this->Col;
    IVar8.y = fVar20;
    IVar8.x = fVar19;
    pIVar6[1].pos = IVar8;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[1].col = this->Col;
    pIVar6[2].pos = auVar31._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[2].col = this->Col;
    pIVar6[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[3].col = this->Col;
    pIVar6[4].pos = IVar22;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar6 + 5;
    uVar14 = DrawList->_VtxCurrentIdx;
    pIVar7 = DrawList->_IdxWritePtr;
    IVar12 = (ImDrawIdx)uVar14;
    *pIVar7 = IVar12;
    uVar13 = (byte)((byte)uVar17 & IVar22.y < fVar20 | -(fVar23 < fVar27) & -(fVar20 < IVar22.y)) &
             1;
    pIVar7[1] = IVar12 + uVar13 + 1;
    pIVar7[2] = IVar12 + 3;
    pIVar7[3] = IVar12 + 1;
    pIVar7[4] = (uVar13 ^ 3) + IVar12;
    pIVar7[5] = IVar12 + 4;
    DrawList->_IdxWritePtr = pIVar7 + 6;
    DrawList->_VtxCurrentIdx = uVar14 + 5;
  }
  (this->P11).x = fVar19;
  (this->P11).y = fVar20;
  (this->P12).x = IVar22.x;
  (this->P12).y = IVar22.y;
  return (char)iVar11 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }